

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O2

void Imf_2_5::copyFromDeepFrameBuffer
               (char **writePtr,char *base,char *sampleCountBase,ptrdiff_t sampleCountXStride,
               ptrdiff_t sampleCountYStride,int y,int xMin,int xMax,int xOffsetForSampleCount,
               int yOffsetForSampleCount,int xOffsetForData,int yOffsetForData,
               ptrdiff_t sampleStride,ptrdiff_t dataXStride,ptrdiff_t dataYStride,Format format,
               PixelType type)

{
  char cVar1;
  ArgExc *this;
  int iVar2;
  int iVar3;
  char *pcVar4;
  uint *puVar5;
  int iVar6;
  long lVar7;
  undefined2 *puVar8;
  uint i;
  int iVar9;
  size_t j;
  long lVar10;
  long lVar11;
  float *pfVar12;
  unsigned_short *puVar13;
  bool bVar14;
  
  iVar6 = (int)sampleCountYStride;
  iVar2 = (int)sampleCountXStride;
  if (format == XDR) {
    if (type == UINT) {
      for (lVar11 = (long)xMin; lVar11 <= xMax; lVar11 = lVar11 + 1) {
        iVar3 = *(int *)(sampleCountBase +
                        (lVar11 - xOffsetForSampleCount) * (long)iVar2 +
                        (long)iVar6 * (long)(y - yOffsetForSampleCount));
        puVar5 = *(uint **)(base + (lVar11 - xOffsetForData) * dataXStride +
                                   (y - yOffsetForData) * dataYStride);
        while (bVar14 = iVar3 != 0, iVar3 = iVar3 + -1, bVar14) {
          Xdr::write<Imf_2_5::CharPtrIO,char*>(writePtr,*puVar5);
          puVar5 = (uint *)((long)puVar5 + sampleStride);
        }
      }
    }
    else if (type == HALF) {
      for (lVar11 = (long)xMin; lVar11 <= xMax; lVar11 = lVar11 + 1) {
        iVar3 = *(int *)(sampleCountBase +
                        (lVar11 - xOffsetForSampleCount) * (long)iVar2 +
                        (long)iVar6 * (long)(y - yOffsetForSampleCount));
        puVar13 = *(unsigned_short **)
                   (base + (lVar11 - xOffsetForData) * dataXStride +
                           (y - yOffsetForData) * dataYStride);
        while (bVar14 = iVar3 != 0, iVar3 = iVar3 + -1, bVar14) {
          Xdr::write<Imf_2_5::CharPtrIO,char*>(writePtr,(half)*puVar13);
          puVar13 = (unsigned_short *)((long)puVar13 + sampleStride);
        }
      }
    }
    else {
      if (type != FLOAT) {
LAB_005422cd:
        this = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(this,"Unknown pixel data type.");
        __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      for (lVar11 = (long)xMin; lVar11 <= xMax; lVar11 = lVar11 + 1) {
        iVar3 = *(int *)(sampleCountBase +
                        (lVar11 - xOffsetForSampleCount) * (long)iVar2 +
                        (long)iVar6 * (long)(y - yOffsetForSampleCount));
        pfVar12 = *(float **)
                   (base + (lVar11 - xOffsetForData) * dataXStride +
                           (y - yOffsetForData) * dataYStride);
        while (bVar14 = iVar3 != 0, iVar3 = iVar3 + -1, bVar14) {
          Xdr::write<Imf_2_5::CharPtrIO,char*>(writePtr,*pfVar12);
          pfVar12 = (float *)((long)pfVar12 + sampleStride);
        }
      }
    }
  }
  else if (type == UINT) {
    for (lVar11 = (long)xMin; lVar11 <= xMax; lVar11 = lVar11 + 1) {
      iVar3 = *(int *)(sampleCountBase +
                      (lVar11 - xOffsetForSampleCount) * (long)iVar2 +
                      (long)iVar6 * (long)(y - yOffsetForSampleCount));
      lVar7 = *(long *)(base + (lVar11 - xOffsetForData) * dataXStride +
                               (y - yOffsetForData) * dataYStride);
      for (iVar9 = 0; iVar9 != iVar3; iVar9 = iVar9 + 1) {
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          cVar1 = *(char *)(lVar7 + lVar10);
          pcVar4 = *writePtr;
          *writePtr = pcVar4 + 1;
          *pcVar4 = cVar1;
        }
        lVar7 = lVar7 + sampleStride;
      }
    }
  }
  else if (type == HALF) {
    pcVar4 = *writePtr;
    for (lVar11 = (long)xMin; lVar11 <= xMax; lVar11 = lVar11 + 1) {
      iVar3 = *(int *)(sampleCountBase +
                      (lVar11 - xOffsetForSampleCount) * (long)iVar2 +
                      (long)iVar6 * (long)(y - yOffsetForSampleCount));
      puVar8 = *(undefined2 **)
                (base + (lVar11 - xOffsetForData) * dataXStride + (y - yOffsetForData) * dataYStride
                );
      while (bVar14 = iVar3 != 0, iVar3 = iVar3 + -1, bVar14) {
        *(undefined2 *)pcVar4 = *puVar8;
        pcVar4 = pcVar4 + 2;
        *writePtr = pcVar4;
        puVar8 = (undefined2 *)((long)puVar8 + sampleStride);
      }
    }
  }
  else {
    if (type != FLOAT) goto LAB_005422cd;
    for (lVar11 = (long)xMin; lVar11 <= xMax; lVar11 = lVar11 + 1) {
      iVar3 = *(int *)(sampleCountBase +
                      (lVar11 - xOffsetForSampleCount) * (long)iVar2 +
                      (long)iVar6 * (long)(y - yOffsetForSampleCount));
      lVar7 = *(long *)(base + (lVar11 - xOffsetForData) * dataXStride +
                               (y - yOffsetForData) * dataYStride);
      for (iVar9 = 0; iVar9 != iVar3; iVar9 = iVar9 + 1) {
        for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
          cVar1 = *(char *)(lVar7 + lVar10);
          pcVar4 = *writePtr;
          *writePtr = pcVar4 + 1;
          *pcVar4 = cVar1;
        }
        lVar7 = lVar7 + sampleStride;
      }
    }
  }
  return;
}

Assistant:

void
copyFromDeepFrameBuffer (char *& writePtr,
                         const char * base,
                         char* sampleCountBase,
                         ptrdiff_t sampleCountXStride,
                         ptrdiff_t sampleCountYStride,
                         int y, int xMin, int xMax,
                         int xOffsetForSampleCount,
                         int yOffsetForSampleCount,
                         int xOffsetForData,
                         int yOffsetForData,
                         ptrdiff_t sampleStride,
                         ptrdiff_t dataXStride,
                         ptrdiff_t dataYStride,
                         Compressor::Format format,
                         PixelType type)
{
    //
    // Copy a horizontal row of pixels from a frame
    // buffer to an output file's line or tile buffer.
    //

    if (format == Compressor::XDR)
    {
        //
        // The the line or tile buffer is in XDR format.
        //

        switch (type)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    Xdr::write <CharPtrIO> (writePtr,
                                            *(const unsigned int *) readPtr);
                    readPtr += sampleStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    Xdr::write <CharPtrIO> (writePtr, *(const half *) readPtr);
                    readPtr += sampleStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;                                   
                                   
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    Xdr::write <CharPtrIO> (writePtr, *(const float *) readPtr);
                    readPtr += sampleStride;
                }
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
    else
    {
        //
        // The the line or tile buffer is in NATIVE format.
        //

        switch (type)
        {
          case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                                   
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;                                                                      
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    for (size_t j = 0; j < sizeof (unsigned int); ++j)
                        *writePtr++ = readPtr[j];

                    readPtr += sampleStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;                                   
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    *(half *) writePtr = *(const half *) readPtr;
                    writePtr += sizeof (half);
                    readPtr += sampleStride;
                }
            }
            break;

          case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

            for (int x = xMin; x <= xMax; x++)
            {
                unsigned int count =
                        sampleCount(sampleCountBase,
                                   sampleCountXStride,
                                   sampleCountYStride,
                                   x - xOffsetForSampleCount,
                                   y - yOffsetForSampleCount);
                                   
                const char* ptr = base + (y-yOffsetForData) * dataYStride + (x-xOffsetForData) * dataXStride;                                   
                const char* readPtr = ((const char**) ptr)[0];
                for (unsigned int i = 0; i < count; i++)
                {
                    for (size_t j = 0; j < sizeof (float); ++j)
                        *writePtr++ = readPtr[j];

                    readPtr += sampleStride;
                }
            }
            break;

          default:

            throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
        }
    }
}